

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<unsigned_long_long,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,unsigned_long_long value,
          basic_format_specs<char> *spec)

{
  byte bVar1;
  int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> local_20;
  
  local_20.prefix_size = 0;
  bVar1 = (byte)spec->field_0x9 >> 4 & 7;
  if (1 < bVar1) {
    local_20.prefix[0] = ' ';
    if (bVar1 == 2) {
      local_20.prefix[0] = '+';
    }
    local_20.prefix_size = 1;
  }
  local_20.writer = (basic_writer<fmt::v6::buffer_range<char>_> *)this;
  local_20.specs = spec;
  local_20.abs_value = value;
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>>
            (spec->type,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }